

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O0

int fill_inbuf(int eof_ok)

{
  int iVar1;
  size_t sVar2;
  int in_EDI;
  int len;
  uint local_4;
  
  insize = 0;
  do {
    sVar2 = fread(inbuf + insize,1,(ulong)(0x8000 - insize),(FILE *)ifd);
    iVar1 = (int)sVar2;
    if ((iVar1 == 0) || (iVar1 == -1)) break;
    insize = iVar1 + insize;
  } while (insize < 0x8000);
  if (insize == 0) {
    if (in_EDI == 0) {
      error((char *)0x258b08);
      exit_code = 1;
      local_4 = 1;
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  else {
    bytes_in = (ulong)insize + bytes_in;
    inptr = 1;
    local_4 = (uint)inbuf[0];
  }
  return local_4;
}

Assistant:

local int fill_inbuf(int eof_ok)
         /* set if EOF acceptable as a result */
{
    int len;

      /* Read as much as possible from file */
      insize = 0;
      do {
        len = fread((char*)inbuf+insize, 1, INBUFSIZ-insize, ifd);
        if (len == 0 || len == EOF) break;
	insize += len;
      } while (insize < INBUFSIZ);

    if (insize == 0) {
	if (eof_ok) return EOF;
	error("unexpected end of file");
        exit_code = ERROR;
        return ERROR;
    }

    bytes_in += (ulg)insize;
    inptr = 1;
    return inbuf[0];
}